

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QRectF>::reallocateAndGrow
          (QArrayDataPointer<QRectF> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRectF> *old)

{
  QArrayData *pQVar1;
  bool bVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  QRectF *pQVar6;
  QRectF *pQVar7;
  qsizetype qVar8;
  long lVar9;
  QRectF *pQVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QArrayDataPointer<QRectF> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QRectF> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar2)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar8 = 0;
        lVar9 = 0;
      }
      else {
        qVar8 = pQVar1->alloc;
        lVar9 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 5);
      }
      auVar11 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x20,qVar8 + n + lVar9,Grow);
      this->d = (Data *)auVar11._0_8_;
      this->ptr = (QRectF *)auVar11._8_8_;
      goto LAB_0060154b;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar9 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar6 = this->ptr;
    pQVar7 = pQVar6 + lVar9;
    if ((old != (QArrayDataPointer<QRectF> *)0x0) || (bVar2)) {
      if ((lVar9 != 0) && (0 < lVar9)) {
        pQVar10 = local_38.ptr + local_38.size;
        do {
          qVar3 = pQVar6->xp;
          qVar4 = pQVar6->yp;
          qVar5 = pQVar6->h;
          pQVar10->w = pQVar6->w;
          pQVar10->h = qVar5;
          pQVar10->xp = qVar3;
          pQVar10->yp = qVar4;
          pQVar6 = pQVar6 + 1;
          local_38.size = local_38.size + 1;
          pQVar10 = pQVar10 + 1;
        } while (pQVar6 < pQVar7);
      }
    }
    else if ((lVar9 != 0) && (0 < lVar9)) {
      pQVar10 = local_38.ptr + local_38.size;
      do {
        qVar3 = pQVar6->xp;
        qVar4 = pQVar6->yp;
        qVar5 = pQVar6->h;
        pQVar10->w = pQVar6->w;
        pQVar10->h = qVar5;
        pQVar10->xp = qVar3;
        pQVar10->yp = qVar4;
        pQVar6 = pQVar6 + 1;
        local_38.size = local_38.size + 1;
        pQVar10 = pQVar10 + 1;
      } while (pQVar6 < pQVar7);
    }
  }
  pQVar1 = &this->d->super_QArrayData;
  pQVar6 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar8 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar1;
  local_38.ptr = pQVar6;
  local_38.size = qVar8;
  if (old != (QArrayDataPointer<QRectF> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pQVar6;
    local_38.size = old->size;
    old->size = qVar8;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x20,0x10);
    }
  }
LAB_0060154b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }